

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t
exr_register_attr_type_handler
          (exr_context_t ctxt,char *type,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr
          *unpack_func_ptr,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *pack_func_ptr,
          _func_void_exr_context_t_void_ptr_int32_t *destroy_unpacked_func_ptr)

{
  exr_attribute_t *peVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  exr_attribute_t **out;
  char **ppcVar6;
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  exr_attribute_list_t *in_RDI;
  uint8_t **in_R8;
  exr_attribute_t **in_stack_00000010;
  int a;
  int nattr;
  int p;
  exr_attribute_list_t *curattrs;
  size_t slen;
  int32_t mlen;
  int32_t tlen;
  exr_result_t rv;
  exr_attribute_t *ent;
  char *in_stack_ffffffffffffff88;
  exr_const_context_t in_stack_ffffffffffffff90;
  int local_64;
  int local_5c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  exr_const_context_t in_stack_ffffffffffffffc8;
  long lVar7;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar8;
  
  if (in_RDI == (exr_attribute_list_t *)0x0) {
    eVar8 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffff90);
    uVar2 = (uint)*(byte *)((long)&in_RDI->num_attributes + 2);
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      internal_exr_unlock(in_stack_ffffffffffffff90);
      eVar8 = (*(code *)in_RDI[2].sorted_entries)(in_RDI,3,"Invalid type to register_attr_handler");
    }
    else {
      out = (exr_attribute_t **)strlen(in_RSI);
      if ((exr_attribute_t **)(long)(int)uVar2 < out) {
        internal_exr_unlock(in_stack_ffffffffffffff90);
        eVar8 = (**(code **)(in_RDI + 3))
                          (in_RDI,0xc,"Provided type name \'%s\' too long for file (len %d, max %d)"
                           ,in_RSI,(ulong)out & 0xffffffff,uVar2);
      }
      else {
        uVar3 = (uint)out;
        iVar4 = internal_exr_is_standard_type(in_stack_ffffffffffffff88);
        if (iVar4 == 0) {
          eVar8 = exr_attr_list_find_by_name
                            (in_stack_ffffffffffffffc8,
                             (exr_attribute_list_t *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),
                             (char *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),out);
          if (eVar8 == 0) {
            internal_exr_unlock(in_stack_ffffffffffffff90);
            eVar8 = (**(code **)(in_RDI + 3))
                              (in_RDI,3,"Attribute handler for \'%s\' previously registered",in_RSI)
            ;
          }
          else {
            lVar7 = 0;
            eVar8 = exr_attr_list_add_by_type
                              ((exr_context_t)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               in_RSI,in_RDX,(int32_t)((ulong)in_RCX >> 0x20),in_R8,
                               in_stack_00000010);
            if (eVar8 == 0) {
              *(char **)(*(long *)(lVar7 + 0x18) + 0x20) = in_RDX;
              *(undefined8 *)(*(long *)(lVar7 + 0x18) + 0x28) = in_RCX;
              *(uint8_t ***)(*(long *)(lVar7 + 0x18) + 0x30) = in_R8;
              eVar8 = 0;
              for (local_5c = 0; local_5c < in_RDI[8].num_alloced; local_5c = local_5c + 1) {
                peVar1 = in_RDI[0x13].sorted_entries[local_5c];
                ppcVar6 = &peVar1->type_name;
                if (ppcVar6 != (char **)0x0) {
                  iVar4 = *(int *)ppcVar6;
                  for (local_64 = 0; local_64 < iVar4; local_64 = local_64 + 1) {
                    lVar7 = *(long *)(*(long *)&peVar1->name_length + (long)local_64 * 8);
                    if ((*(byte *)(lVar7 + 0x11) == uVar3) &&
                       (iVar5 = strcmp(*(char **)(lVar7 + 8),in_RSI), iVar5 == 0)) {
                      *(char **)(*(long *)(lVar7 + 0x18) + 0x20) = in_RDX;
                      *(undefined8 *)(*(long *)(lVar7 + 0x18) + 0x28) = in_RCX;
                      *(uint8_t ***)(*(long *)(lVar7 + 0x18) + 0x30) = in_R8;
                    }
                  }
                }
              }
              internal_exr_unlock(in_stack_ffffffffffffff90);
            }
            else {
              internal_exr_unlock(in_stack_ffffffffffffff90);
              eVar8 = (**(code **)(in_RDI + 3))
                                (in_RDI,eVar8,"Unable to register custom handler for type \'%s\'",
                                 in_RSI);
            }
          }
        }
        else {
          internal_exr_unlock(in_stack_ffffffffffffff90);
          eVar8 = (**(code **)(in_RDI + 3))
                            (in_RDI,3,"Provided type name \'%s\' is a reserved / internal type name"
                             ,in_RSI);
        }
      }
    }
  }
  return eVar8;
}

Assistant:

exr_result_t
exr_register_attr_type_handler (
    exr_context_t ctxt,
    const char*   type,
    exr_result_t (*unpack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       attrsize,
        int32_t*      outsize,
        void**        outbuffer),
    exr_result_t (*pack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       datasize,
        int32_t*      outsize,
        void*         outbuffer),
    void (*destroy_unpacked_func_ptr) (
        exr_context_t ctxt, void* data, int32_t datasize))
{
    exr_attribute_t*      ent;
    exr_result_t          rv;
    int32_t               tlen, mlen = EXR_SHORTNAME_MAXLEN;
    size_t                slen;
    exr_attribute_list_t* curattrs;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    internal_exr_lock (ctxt);

    mlen = (int32_t) ctxt->max_name_length;

    if (!type || type[0] == '\0')
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type to register_attr_handler"));

    slen = strlen (type);
    if (slen > (size_t) mlen)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen));
    tlen = (int32_t) slen;

    if (internal_exr_is_standard_type (type))
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Provided type name '%s' is a reserved / internal type name",
            type));

    rv =
        exr_attr_list_find_by_name (ctxt, &(ctxt->custom_handlers), type, &ent);
    if (rv == EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attribute handler for '%s' previously registered",
            type));

    ent = NULL;
    rv  = exr_attr_list_add_by_type (
        ctxt, &(ctxt->custom_handlers), type, type, 0, NULL, &ent);
    if (rv != EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt, rv, "Unable to register custom handler for type '%s'", type));

    ent->opaque->unpack_func_ptr           = unpack_func_ptr;
    ent->opaque->pack_func_ptr             = pack_func_ptr;
    ent->opaque->destroy_unpacked_func_ptr = destroy_unpacked_func_ptr;

    for (int p = 0; p < ctxt->num_parts; ++p)
    {
        curattrs = &(ctxt->parts[p]->attributes);
        if (curattrs)
        {
            int nattr = curattrs->num_attributes;
            for (int a = 0; a < nattr; ++a)
            {
                ent = curattrs->entries[a];
                if (ent->type_name_length == tlen &&
                    0 == strcmp (ent->type_name, type))
                {
                    ent->opaque->unpack_func_ptr = unpack_func_ptr;
                    ent->opaque->pack_func_ptr   = pack_func_ptr;
                    ent->opaque->destroy_unpacked_func_ptr =
                        destroy_unpacked_func_ptr;
                }
            }
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}